

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O0

void __thiscall ipv4_address::ipv4_address(ipv4_address *this,string *text)

{
  char *__cp;
  ostream *poVar1;
  runtime_error *this_00;
  string local_1d8 [48];
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  int local_20;
  ipv4_address local_1c;
  int res;
  in_addr tmp;
  string *text_local;
  ipv4_address *this_local;
  
  _res = text;
  memset(&local_1c,0,4);
  __cp = (char *)std::__cxx11::string::c_str();
  local_20 = inet_pton(2,__cp,&local_1c);
  if (local_20 == 0) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar1 = std::operator<<(local_198,'\'');
    poVar1 = std::operator<<(poVar1,(string *)_res);
    std::operator<<(poVar1,"\' is not a valid ip address");
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(this_00,local_1d8);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this->addr_net = (uint32_t)local_1c;
  return;
}

Assistant:

ipv4_address::ipv4_address(const std::string &text)
{
    in_addr tmp{};
    int res = inet_pton(AF_INET, text.c_str(), &tmp);
    if (res == 0)
    {
        std::stringstream ss;
        ss << '\'' << text << "' is not a valid ip address";
        throw std::runtime_error(ss.str());
    }
    addr_net = tmp.s_addr;
}